

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::ConstraintSet::calcVelocityError
          (ConstraintSet *this,uint groupIndex,Model *model,VectorNd *Q,VectorNd *QDot,
          VectorNd *velErrUpd,bool updKin)

{
  long lVar1;
  
  if (updKin) {
    UpdateKinematicsCustom(model,Q,QDot,(VectorNd *)0x0);
  }
  lVar1 = (ulong)groupIndex * 0x10;
  (**(code **)(**(long **)(*(long *)(this + 200) + lVar1) + 8))
            (0,*(long **)(*(long *)(this + 200) + lVar1),model,Q,QDot,this + 0x198,this + 0x620,
             updKin);
  (**(code **)(**(long **)(*(long *)(this + 200) + lVar1) + 0x20))
            (0,*(long **)(*(long *)(this + 200) + lVar1),model,Q,QDot,this + 0x198,this + 0x120,
             this + 0x620,updKin);
  Constraint::getVelocityError
            (*(Constraint **)(*(long *)(this + 200) + lVar1),(VectorNd *)(this + 0x120),velErrUpd);
  return;
}

Assistant:

void ConstraintSet::calcVelocityError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  Math::VectorNd &velErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //Update the constraint Jacobian of this constraint
  constraints[groupIndex]->calcConstraintJacobian(model,0.,Q,QDot,G,cache,
      updKin);

  //Update the velocity-level errors of this constraint
  constraints[groupIndex]->calcVelocityError(model,0.,Q,QDot,G,errd,cache,
      updKin);

  //Pick out the sub vector of velocity errors for this constraint from
  //the system error vector.
  constraints[groupIndex]->getVelocityError(errd,velErrUpd);

}